

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib_ffi.c
# Opt level: O1

int lj_cf_ffi_meta___tostring(lua_State *L)

{
  CTState *cts;
  CType *pCVar1;
  uint64_t uVar2;
  GCcdata *pGVar3;
  GCstr *pGVar4;
  cTValue *tv;
  CType *pCVar5;
  uint uVar6;
  CTypeID id;
  int in_ESI;
  GCcdata *sp;
  char *fmt;
  TValue *pTVar7;
  char cVar8;
  
  pGVar3 = ffi_checkcdata(L,in_ESI);
  id = (CTypeID)pGVar3->ctypeid;
  sp = pGVar3 + 1;
  uVar6 = (uint)pGVar3->ctypeid;
  if (uVar6 == 0x16) {
    id = (CTypeID)(sp->nextgc).gcptr64;
    fmt = "ctype<%s>";
  }
  else {
    cts = *(CTState **)((L->glref).ptr64 + 0x180);
    cts->L = L;
    pCVar1 = cts->tab;
    pCVar5 = pCVar1 + uVar6;
    pGVar3 = sp;
    if ((pCVar1[uVar6].info & 0xf0800000) == 0x20800000) {
      pCVar5 = pCVar1 + (ushort)pCVar5->info;
      pGVar3 = (GCcdata *)(sp->nextgc).gcptr64;
    }
    uVar6 = pCVar5->info;
    if ((uVar6 & 0xf4000000) == 0x34000000) {
      pTVar7 = L->top;
      pGVar4 = lj_ctype_repr_complex(L,sp,pCVar5->size);
LAB_00121334:
      pTVar7[-1].u64 = (ulong)pGVar4 | 0xfffd800000000000;
      cVar8 = '\x02';
      fmt = "cdata<%s>: %p";
      sp = pGVar3;
    }
    else {
      if (uVar6 < 0x4000000 && pCVar5->size == 8) {
        pTVar7 = L->top;
        pGVar4 = lj_ctype_repr_int64(L,(sp->nextgc).gcptr64,uVar6 & 0x800000);
        goto LAB_00121334;
      }
      uVar6 = uVar6 >> 0x1c;
      if (uVar6 == 2) {
        if (pCVar5->size == 4) {
          sp = (GCcdata *)(ulong)(uint)(pGVar3->nextgc).gcptr64;
        }
        else {
          sp = (GCcdata *)(pGVar3->nextgc).gcptr64;
        }
        pCVar5 = pCVar1 + (ushort)pCVar5->info;
LAB_00121406:
        fmt = "cdata<%s>: %p";
        if ((pCVar5->info & 0xf0000000) == 0x10000000 || (pCVar5->info & 0xf8000000) == 0x38000000)
        {
          tv = lj_ctype_meta(cts,(int)((ulong)((long)pCVar5 - (long)pCVar1) >> 3) * -0x55555555,
                             MM_tostring);
          if (tv != (cTValue *)0x0) {
            uVar6 = lj_meta_tailcall(L,tv);
            pGVar3 = (GCcdata *)(ulong)uVar6;
          }
          cVar8 = tv != (cTValue *)0x0;
        }
        else {
          cVar8 = '\0';
        }
      }
      else if (uVar6 == 5) {
        sp = (GCcdata *)(pGVar3->nextgc).gcptr64;
        cVar8 = '\0';
        fmt = "cdata<%s>: %d";
      }
      else {
        sp = pGVar3;
        if (uVar6 != 6) goto LAB_00121406;
        sp = (GCcdata *)(pGVar3->nextgc).gcptr64;
        cVar8 = '\0';
        fmt = "cdata<%s>: %p";
      }
    }
    if (cVar8 == '\x02') goto LAB_0012137d;
    if (cVar8 != '\0') {
      return (int)pGVar3;
    }
  }
  pGVar4 = lj_ctype_repr(L,id,(GCstr *)0x0);
  lj_strfmt_pushf(L,fmt,pGVar4 + 1,sp);
LAB_0012137d:
  uVar2 = (L->glref).ptr64;
  if (*(ulong *)(uVar2 + 0x18) <= *(ulong *)(uVar2 + 0x10)) {
    lj_gc_step(L);
  }
  return 1;
}

Assistant:

LJLIB_CF(ffi_meta___tostring)
{
  GCcdata *cd = ffi_checkcdata(L, 1);
  const char *msg = "cdata<%s>: %p";
  CTypeID id = cd->ctypeid;
  void *p = cdataptr(cd);
  if (id == CTID_CTYPEID) {
    msg = "ctype<%s>";
    id = *(CTypeID *)p;
  } else {
    CTState *cts = ctype_cts(L);
    CType *ct = ctype_raw(cts, id);
    if (ctype_isref(ct->info)) {
      p = *(void **)p;
      ct = ctype_rawchild(cts, ct);
    }
    if (ctype_iscomplex(ct->info)) {
      setstrV(L, L->top-1, lj_ctype_repr_complex(L, cdataptr(cd), ct->size));
      goto checkgc;
    } else if (ct->size == 8 && ctype_isinteger(ct->info)) {
      setstrV(L, L->top-1, lj_ctype_repr_int64(L, *(uint64_t *)cdataptr(cd),
					       (ct->info & CTF_UNSIGNED)));
      goto checkgc;
    } else if (ctype_isfunc(ct->info)) {
      p = *(void **)p;
    } else if (ctype_isenum(ct->info)) {
      msg = "cdata<%s>: %d";
      p = (void *)(uintptr_t)*(uint32_t **)p;
    } else {
      if (ctype_isptr(ct->info)) {
	p = cdata_getptr(p, ct->size);
	ct = ctype_rawchild(cts, ct);
      }
      if (ctype_isstruct(ct->info) || ctype_isvector(ct->info)) {
	/* Handle ctype __tostring metamethod. */
	cTValue *tv = lj_ctype_meta(cts, ctype_typeid(cts, ct), MM_tostring);
	if (tv)
	  return lj_meta_tailcall(L, tv);
      }
    }
  }
  lj_strfmt_pushf(L, msg, strdata(lj_ctype_repr(L, id, NULL)), p);
checkgc:
  lj_gc_check(L);
  return 1;
}